

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_alias.cpp
# Opt level: O1

bool __thiscall duckdb::BindingAlias::Matches(BindingAlias *this,BindingAlias *other)

{
  bool bVar1;
  
  if (((other->catalog)._M_string_length != 0) &&
     (bVar1 = StringUtil::CIEquals((string *)this,(string *)other), !bVar1)) {
    return false;
  }
  if (((other->schema)._M_string_length != 0) &&
     (bVar1 = StringUtil::CIEquals((string *)&this->schema,(string *)&other->schema), !bVar1)) {
    return false;
  }
  bVar1 = StringUtil::CIEquals((string *)&this->alias,(string *)&other->alias);
  return bVar1;
}

Assistant:

bool BindingAlias::Matches(const BindingAlias &other) const {
	// we match based on the specificity of the other entry
	// i.e. "tbl" matches "catalog.schema.tbl"
	// but "schema2.tbl" does not match "schema.tbl"
	if (!other.catalog.empty()) {
		if (!StringUtil::CIEquals(catalog, other.catalog)) {
			return false;
		}
	}
	if (!other.schema.empty()) {
		if (!StringUtil::CIEquals(schema, other.schema)) {
			return false;
		}
	}
	return StringUtil::CIEquals(alias, other.alias);
}